

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmArraySetup(LlvmCompilationContext *ctx,ExprArraySetup *node)

{
  LLVMBuilderRef pLVar1;
  LLVMBuilderRef pLVar2;
  int iVar3;
  TypeRef *pTVar4;
  TypeArray *pTVar5;
  LLVMValueRef pLVar6;
  TypeBase *valueType;
  LLVMValueRef pLVar7;
  LLVMTypeRef pLVar8;
  LLVMValueRef pLVar9;
  LLVMBasicBlockRef pLVar10;
  LLVMBasicBlockRef pLVar11;
  LLVMBasicBlockRef pLVar12;
  LLVMValueRef pLVar13;
  LLVMValueRef pLVar14;
  LLVMValueRef local_78;
  LLVMValueRef indices [2];
  LLVMValueRef offset;
  LLVMValueRef condition;
  LLVMBasicBlockRef exitBlock;
  LLVMBasicBlockRef bodyBlock;
  LLVMBasicBlockRef conditionBlock;
  LLVMValueRef offsetPtr;
  LLVMValueRef address;
  LLVMValueRef initializer;
  TypeArray *arrayType;
  TypeRef *refType;
  ExprArraySetup *node_local;
  LlvmCompilationContext *ctx_local;
  
  pTVar4 = getType<TypeRef>(node->lhs->type);
  if (pTVar4 == (TypeRef *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x62c,
                  "LLVMValueRef CompileLlvmArraySetup(LlvmCompilationContext &, ExprArraySetup *)");
  }
  pTVar5 = getType<TypeArray>(pTVar4->subType);
  if (pTVar5 != (TypeArray *)0x0) {
    pLVar6 = CompileLlvm(ctx,node->initializer);
    valueType = GetStackType(ctx,node->initializer->type);
    pLVar6 = ConvertToDataType(ctx,pLVar6,valueType,node->initializer->type);
    pLVar7 = CompileLlvm(ctx,node->lhs);
    pLVar1 = ctx->builder;
    pLVar8 = CompileLlvmType(ctx,ctx->ctx->typeInt);
    pLVar9 = LLVMBuildAlloca(pLVar1,pLVar8,"arr_it");
    pLVar10 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"arr_setup_cond");
    pLVar11 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"arr_setup_body");
    pLVar12 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"arr_setup_exit");
    pLVar1 = ctx->builder;
    pLVar8 = CompileLlvmType(ctx,ctx->ctx->typeInt);
    pLVar13 = LLVMConstInt(pLVar8,0,true);
    LLVMBuildStore(pLVar1,pLVar13,pLVar9);
    LLVMBuildBr(ctx->builder,pLVar10);
    LLVMPositionBuilderAtEnd(ctx->builder,pLVar10);
    iVar3 = LLVMIntSLT;
    if ((long)((int)pTVar5->length * (int)pTVar5->subType->size) ==
        pTVar5->length * pTVar5->subType->size) {
      pLVar1 = ctx->builder;
      pLVar13 = LLVMBuildLoad(ctx->builder,pLVar9,"");
      pLVar8 = CompileLlvmType(ctx,ctx->ctx->typeInt);
      pLVar14 = LLVMConstInt(pLVar8,(long)(int)pTVar5->length,true);
      pLVar13 = LLVMBuildICmp(pLVar1,iVar3,pLVar13,pLVar14,"");
      LLVMBuildCondBr(ctx->builder,pLVar13,pLVar11,pLVar12);
      LLVMPositionBuilderAtEnd(ctx->builder,pLVar11);
      indices[1] = LLVMBuildLoad(ctx->builder,pLVar9,"");
      pLVar8 = LLVMInt32TypeInContext(ctx->context);
      local_78 = LLVMConstInt(pLVar8,0,true);
      indices[0] = indices[1];
      pLVar1 = ctx->builder;
      pLVar7 = LLVMBuildGEP(ctx->builder,pLVar7,&local_78,2,"");
      LLVMBuildStore(pLVar1,pLVar6,pLVar7);
      pLVar6 = indices[1];
      pLVar1 = ctx->builder;
      pLVar2 = ctx->builder;
      pLVar8 = CompileLlvmType(ctx,ctx->ctx->typeInt);
      pLVar7 = LLVMConstInt(pLVar8,1,true);
      pLVar6 = LLVMBuildAdd(pLVar2,pLVar6,pLVar7,"");
      LLVMBuildStore(pLVar1,pLVar6,pLVar9);
      LLVMBuildBr(ctx->builder,pLVar10);
      LLVMPositionBuilderAtEnd(ctx->builder,pLVar12);
      pLVar6 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
      return pLVar6;
    }
    __assert_fail("int(arrayType->length * arrayType->subType->size) == arrayType->length * arrayType->subType->size"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x645,
                  "LLVMValueRef CompileLlvmArraySetup(LlvmCompilationContext &, ExprArraySetup *)");
  }
  __assert_fail("arrayType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                ,0x630,
                "LLVMValueRef CompileLlvmArraySetup(LlvmCompilationContext &, ExprArraySetup *)");
}

Assistant:

LLVMValueRef CompileLlvmArraySetup(LlvmCompilationContext &ctx, ExprArraySetup *node)
{
	TypeRef *refType = getType<TypeRef>(node->lhs->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);

	LLVMValueRef initializer = CompileLlvm(ctx, node->initializer);

	initializer = ConvertToDataType(ctx, initializer, GetStackType(ctx, node->initializer->type), node->initializer->type);

	LLVMValueRef address = CompileLlvm(ctx, node->lhs);

	LLVMValueRef offsetPtr = LLVMBuildAlloca(ctx.builder, CompileLlvmType(ctx, ctx.ctx.typeInt), "arr_it");

	LLVMBasicBlockRef conditionBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "arr_setup_cond");
	LLVMBasicBlockRef bodyBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "arr_setup_body");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "arr_setup_exit");

	LLVMBuildStore(ctx.builder, LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 0, true), offsetPtr);

	LLVMBuildBr(ctx.builder, conditionBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, conditionBlock);

	// Offset will move in element size steps, so it will reach the full size of the array
	assert(int(arrayType->length * arrayType->subType->size) == arrayType->length * arrayType->subType->size);

	// While offset is less than array size
	LLVMValueRef condition = LLVMBuildICmp(ctx.builder, LLVMIntSLT, LLVMBuildLoad(ctx.builder, offsetPtr, ""), LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), int(arrayType->length), true), "");

	LLVMBuildCondBr(ctx.builder, condition, bodyBlock, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, bodyBlock);

	LLVMValueRef offset = LLVMBuildLoad(ctx.builder, offsetPtr, "");

	LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), offset };

	LLVMBuildStore(ctx.builder, initializer, LLVMBuildGEP(ctx.builder, address, indices, 2, ""));
	LLVMBuildStore(ctx.builder, LLVMBuildAdd(ctx.builder, offset, LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 1, true), ""), offsetPtr);

	LLVMBuildBr(ctx.builder, conditionBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	return CheckType(ctx, node, NULL);
}